

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

void CheckRamLimitExceeded(void)

{
  char *pcVar1;
  char local_48 [8];
  char buf [64];
  
  if ((Options::IsLongPtr & 1) == 0) {
    if (CurAddress < 0x10000) {
      CheckRamLimitExceeded::notWarnedCurAdr = true;
    }
    else {
      if ((pass == 3) && (CheckRamLimitExceeded::notWarnedCurAdr)) {
        pcVar1 = "ORG";
        if (PseudoORG != DISP_NONE) {
          pcVar1 = "DISP";
        }
        snprintf(local_48,0x40,"RAM limit exceeded 0x%X by %s",(ulong)(uint)CurAddress,pcVar1);
        Warning(local_48,(char *)0x0,W_PASS3);
        CheckRamLimitExceeded::notWarnedCurAdr = false;
      }
      if (PseudoORG != DISP_NONE) {
        CurAddress = CurAddress & 0xffff;
      }
    }
    if ((PseudoORG == DISP_NONE) || (adrdisp < 0x10000)) {
      CheckRamLimitExceeded::notWarnedDisp = true;
    }
    else if ((pass == 3) && ((CheckRamLimitExceeded::notWarnedDisp & 1U) != 0)) {
      snprintf(local_48,0x40,"RAM limit exceeded 0x%X by ORG",(ulong)(uint)adrdisp);
      Warning(local_48,(char *)0x0,W_PASS3);
      CheckRamLimitExceeded::notWarnedDisp = false;
    }
  }
  return;
}

Assistant:

void CheckRamLimitExceeded() {
	if (Options::IsLongPtr) return;		// in "longptr" mode with no device keep the address as is
	static bool notWarnedCurAdr = true;
	static bool notWarnedDisp = true;
	char buf[64];
	if (CurAddress >= 0x10000) {
		if (LASTPASS == pass && notWarnedCurAdr) {
			SPRINTF2(buf, 64, "RAM limit exceeded 0x%X by %s",
					 (unsigned int)CurAddress, DISP_NONE != PseudoORG ? "DISP":"ORG");
			Warning(buf);
			notWarnedCurAdr = false;
		}
		if (DISP_NONE != PseudoORG) CurAddress &= 0xFFFF;	// fake DISP address gets auto-wrapped FFFF->0
	} else notWarnedCurAdr = true;
	if (DISP_NONE != PseudoORG && adrdisp >= 0x10000) {
		if (LASTPASS == pass && notWarnedDisp) {
			SPRINTF1(buf, 64, "RAM limit exceeded 0x%X by ORG", (unsigned int)adrdisp);
			Warning(buf);
			notWarnedDisp = false;
		}
	} else notWarnedDisp = true;
}